

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>_>
::Data(Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>_>
       *this,Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>_>
             *other)

{
  Entry *pEVar1;
  uchar *puVar2;
  byte bVar3;
  Span *pSVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  AnchorVertex *pAVar7;
  undefined8 uVar8;
  Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *pNVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  R RVar13;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar11 = other->numBuckets;
  sVar12 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar12;
  this->spans = (Span *)0x0;
  RVar13 = allocateSpans(sVar11);
  this->spans = (Span *)RVar13.spans;
  if (RVar13.nSpans != 0) {
    lVar10 = 0;
    sVar11 = 0;
    do {
      pSVar4 = other->spans;
      sVar12 = 0;
      do {
        bVar3 = pSVar4->offsets[sVar12 + lVar10];
        if (bVar3 != 0xff) {
          pEVar5 = pSVar4[sVar11].entries;
          pNVar9 = Span<QHashPrivate::Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>_>
                   ::insert(this->spans + sVar11,sVar12);
          pEVar1 = pEVar5 + bVar3;
          uVar6 = *(undefined8 *)((pEVar1->storage).data + 8);
          puVar2 = pEVar5[bVar3].storage.data + 0x10;
          pAVar7 = *(AnchorVertex **)puVar2;
          uVar8 = *(undefined8 *)(puVar2 + 8);
          (pNVar9->key).first = *(QGraphicsLayoutItem **)(pEVar1->storage).data;
          *(undefined8 *)&(pNVar9->key).second = uVar6;
          (pNVar9->value).first = pAVar7;
          *(undefined8 *)&(pNVar9->value).second = uVar8;
        }
        sVar12 = sVar12 + 1;
      } while (sVar12 != 0x80);
      sVar11 = sVar11 + 1;
      lVar10 = lVar10 + 0x90;
    } while (sVar11 != RVar13.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }